

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *pIVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  pIVar4 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  pIVar1 = &pIVar4->SettingsIniData;
  iVar2 = (pIVar4->SettingsIniData).Buf.Capacity;
  if (iVar2 < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pcVar5 = (char *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar5,pcVar6,(long)(pIVar4->SettingsIniData).Buf.Size);
      pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
      if (pcVar6 != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pcVar6,GImAllocatorUserData);
    }
    (pIVar4->SettingsIniData).Buf.Data = pcVar5;
    (pIVar4->SettingsIniData).Buf.Size = 0;
    (pIVar4->SettingsIniData).Buf.Capacity = 0;
  }
  else {
    (pIVar1->Buf).Size = 0;
    if (iVar2 != 0) {
      pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
      lVar7 = 0;
      goto LAB_0017d7ea;
    }
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  pcVar6 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
  pcVar5 = (pIVar4->SettingsIniData).Buf.Data;
  if (pcVar5 != (char *)0x0) {
    memcpy(pcVar6,pcVar5,(long)(pIVar4->SettingsIniData).Buf.Size);
    pcVar5 = (pIVar4->SettingsIniData).Buf.Data;
    if (pcVar5 != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pcVar5,GImAllocatorUserData);
  }
  (pIVar4->SettingsIniData).Buf.Data = pcVar6;
  (pIVar4->SettingsIniData).Buf.Capacity = 8;
  lVar7 = (long)(pIVar4->SettingsIniData).Buf.Size;
LAB_0017d7ea:
  pcVar6[lVar7] = '\0';
  (pIVar4->SettingsIniData).Buf.Size = (pIVar4->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar4->SettingsHandlers).Size) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pIVar3 = (pIVar4->SettingsHandlers).Data;
      (**(code **)((long)&pIVar3->WriteAllFn + lVar7))
                (pIVar4,(long)&pIVar3->TypeName + lVar7,pIVar1);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar8 < (pIVar4->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    *out_size = (long)(pIVar1->Buf).Size - 1;
  }
  return (pIVar4->SettingsIniData).Buf.Data;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}